

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_inflatev(ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uchar *puVar1;
  ushort uVar2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint *bitlen;
  uint *__s;
  uint *bitlen_00;
  sbyte sVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  uint *puVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  HuffmanTree *codetree;
  ulong uVar18;
  size_t sVar19;
  ucvector *p;
  uint *puVar20;
  long lVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  long lVar25;
  HuffmanTree tree_ll;
  LodePNGBitReader local_148;
  uint *local_120;
  ucvector *local_118;
  uint local_10c;
  LodePNGDecompressSettings *local_108;
  uint local_fc;
  HuffmanTree *local_f8;
  HuffmanTree *local_f0;
  uint *local_e8;
  ulong local_e0;
  unsigned_short *local_d8;
  uint local_cc;
  long local_c8;
  ulong local_c0;
  HuffmanTree local_b8;
  HuffmanTree local_88;
  HuffmanTree local_58;
  
  local_148.bitsize = insize * 8;
  uVar16 = 0x69;
  if (local_148.bitsize < 0xffffffffffffffc0 && insize >> 0x3d == 0) {
    local_148.bp = 0;
    local_148.data = in;
    local_148.size = insize;
    local_118 = out;
    local_108 = settings;
    do {
      sVar5 = local_148.bp;
      sVar19 = local_148.bitsize;
      sVar3 = local_148.size;
      puVar1 = local_148.data;
      if (local_148.bitsize - local_148.bp < 3) {
        return 0x34;
      }
      uVar18 = local_148.bp >> 3;
      if (uVar18 + 1 < local_148.size) {
        local_fc = (uint)*(ushort *)(local_148.data + uVar18);
      }
      else {
        local_fc = 0;
        if (uVar18 < local_148.size) {
          local_fc = (uint)local_148.data[uVar18];
        }
      }
      local_fc = local_fc >> ((byte)local_148.bp & 7);
      local_148.buffer = local_fc >> 3;
      uVar18 = local_148.bp + 3;
      uVar16 = local_fc >> 1 & 3;
      if (uVar16 == 0) {
        uVar17 = local_148.bp + 10 >> 3;
        uVar22 = uVar17 + 4;
        if (local_148.size <= uVar22) {
          return 0x34;
        }
        uVar2 = *(ushort *)(local_148.data + uVar17);
        uVar12 = (ulong)uVar2;
        if ((settings->ignore_nlen == 0) &&
           ((uint)*(ushort *)(local_148.data + uVar17 + 2) + (uint)uVar2 != 0xffff)) {
          return 0x15;
        }
        sVar19 = out->size + uVar12;
        out->size = sVar19;
        local_148.bp = uVar18;
        uVar16 = ucvector_reserve(out,sVar19);
        out = local_118;
        if (uVar16 == 0) {
          return 0x53;
        }
        if (sVar3 < uVar12 + uVar22) {
          return 0x17;
        }
        if (uVar2 != 0) {
          memcpy(local_118->data + (local_118->size - uVar12),puVar1 + uVar22,uVar12);
          uVar22 = uVar12 + uVar22;
        }
        local_148.bp = uVar22 << 3;
        settings = local_108;
      }
      else {
        if (uVar16 == 3) {
          return 0x14;
        }
        uVar22 = settings->max_output_size;
        local_148.bp = uVar18;
        uVar6 = ucvector_reserve(out,out->size + 0x104);
        if (uVar6 == 0) {
          return 0x53;
        }
        local_88.codes = (uint *)0x0;
        local_88.lengths = (uint *)0x0;
        local_88.table_len = (uchar *)0x0;
        local_88.table_value = (unsigned_short *)0x0;
        local_b8.codes = (uint *)0x0;
        local_b8.lengths = (uint *)0x0;
        local_b8.table_len = (uchar *)0x0;
        local_b8.table_value = (unsigned_short *)0x0;
        if (uVar16 == 1) {
          uVar16 = generateFixedLitLenTree(&local_88);
          settings = local_108;
          if (uVar16 == 0) {
            uVar16 = generateFixedDistanceTree(&local_b8);
            goto LAB_001dd273;
          }
        }
        else {
          uVar16 = 0x31;
          settings = local_108;
          if (sVar19 - uVar18 < 0xe) goto LAB_001dd273;
          uVar12 = uVar18 >> 3;
          uVar17 = uVar12 + 2;
          if (uVar17 < sVar3) {
            uVar6 = (uint)*(ushort *)(local_148.data + uVar12);
            sVar9 = 0x10;
LAB_001dd0d9:
            uVar6 = uVar6 + ((uint)local_148.data[uVar17] << sVar9);
          }
          else {
            uVar6 = 0;
            if (uVar12 < sVar3) {
              uVar6 = (uint)local_148.data[uVar12];
            }
            uVar17 = uVar12 + 1;
            if (uVar17 < sVar3) {
              sVar9 = 8;
              goto LAB_001dd0d9;
            }
          }
          uVar6 = uVar6 >> ((byte)uVar18 & 7);
          local_148.buffer = uVar6 >> 0xe;
          uVar18 = sVar5 + 0x11;
          local_148.bp = uVar18;
          bitlen = (uint *)malloc(0x4c);
          if (bitlen == (uint *)0x0) {
            uVar16 = 0x53;
            settings = local_108;
            goto LAB_001dd273;
          }
          uVar16 = uVar6 >> 10 & 0xf;
          uVar17 = (ulong)uVar16;
          iVar13 = uVar16 + 4;
          local_58.codes = (uint *)0x0;
          local_58.lengths = (uint *)0x0;
          local_58.table_len = (uchar *)0x0;
          local_58.table_value = (unsigned_short *)0x0;
          uVar12 = (uint)(iVar13 * 3) + uVar18;
          if (sVar19 < uVar12 || uVar12 < uVar18) {
            uVar6 = 0x32;
LAB_001dd241:
            __s = (uint *)0x0;
            bitlen_00 = (uint *)0x0;
            uVar16 = uVar6;
          }
          else {
            uVar16 = 0x32;
            local_e0 = (ulong)(uVar6 & 0x1f);
            local_f8 = (HuffmanTree *)CONCAT44(local_f8._4_4_,(uVar6 & 0x1f) + 0x101);
            local_f0 = (HuffmanTree *)(ulong)((uVar6 >> 5 & 0x1f) + 1);
            lVar25 = 0;
            do {
              uVar12 = uVar18 >> 3;
              if (uVar12 + 1 < sVar3) {
                uVar6 = (uint)*(ushort *)(local_148.data + uVar12);
              }
              else {
                uVar6 = 0;
                if (uVar12 < sVar3) {
                  uVar6 = (uint)local_148.data[uVar12];
                }
              }
              uVar6 = uVar6 >> ((byte)uVar18 & 7);
              local_148.buffer = uVar6 >> 3;
              uVar18 = uVar18 + 3;
              bitlen[*(uint *)((long)CLCL_ORDER + lVar25)] = uVar6 & 7;
              lVar25 = lVar25 + 4;
            } while (uVar17 * 4 + 0x10 != lVar25);
            if (iVar13 != 0x13) {
              do {
                bitlen[CLCL_ORDER[uVar17 + 4]] = 0;
                uVar17 = uVar17 + 1;
              } while (uVar17 != 0xf);
            }
            local_148.bp = uVar18;
            uVar6 = HuffmanTree_makeFromLengths(&local_58,bitlen,0x13,7);
            if (uVar6 != 0) goto LAB_001dd241;
            __s = (uint *)malloc(0x480);
            bitlen_00 = (uint *)malloc(0x80);
            if (bitlen_00 == (uint *)0x0 || __s == (uint *)0x0) {
              uVar16 = 0x53;
            }
            else {
              uVar23 = 0;
              local_120 = __s;
              local_e8 = bitlen;
              memset(__s,0,0x480);
              bitlen_00[0] = 0;
              bitlen_00[1] = 0;
              bitlen_00[2] = 0;
              bitlen_00[3] = 0;
              bitlen_00[4] = 0;
              bitlen_00[5] = 0;
              bitlen_00[6] = 0;
              bitlen_00[7] = 0;
              bitlen_00[8] = 0;
              bitlen_00[9] = 0;
              bitlen_00[10] = 0;
              bitlen_00[0xb] = 0;
              bitlen_00[0xc] = 0;
              bitlen_00[0xd] = 0;
              bitlen_00[0xe] = 0;
              bitlen_00[0xf] = 0;
              bitlen_00[0x10] = 0;
              bitlen_00[0x11] = 0;
              bitlen_00[0x12] = 0;
              bitlen_00[0x13] = 0;
              bitlen_00[0x14] = 0;
              bitlen_00[0x15] = 0;
              bitlen_00[0x16] = 0;
              bitlen_00[0x17] = 0;
              bitlen_00[0x18] = 0;
              bitlen_00[0x19] = 0;
              bitlen_00[0x1a] = 0;
              bitlen_00[0x1b] = 0;
              bitlen_00[0x1c] = 0;
              bitlen_00[0x1d] = 0;
              bitlen_00[0x1e] = 0;
              bitlen_00[0x1f] = 0;
              uVar6 = (int)local_f0 + (uint)local_f8;
              uVar18 = (ulong)uVar6;
              local_f0 = (HuffmanTree *)local_58.table_len;
              local_d8 = local_58.table_value;
              local_cc = (int)local_e0 + 0x102;
              local_c0 = (ulong)local_f8 & 0xffffffff;
              uVar7 = -(int)local_e0;
              local_e0 = (ulong)uVar7;
              local_c8 = (long)(int)uVar7 + -0x101;
              local_10c = 0;
              do {
                uVar17 = local_148.bp >> 3;
                if (uVar17 + 3 < local_148.size) {
                  local_148.buffer = *(uint *)(local_148.data + uVar17);
                }
                else {
                  local_148.buffer = 0;
                  if (uVar17 < local_148.size) {
                    local_148.buffer = (uint)local_148.data[uVar17];
                  }
                  if (uVar17 + 1 < local_148.size) {
                    local_148.buffer = local_148.buffer | (uint)local_148.data[uVar17 + 1] << 8;
                  }
                  if (uVar17 + 2 < local_148.size) {
                    local_148.buffer = local_148.buffer | (uint)local_148.data[uVar17 + 2] << 0x10;
                  }
                }
                local_148.buffer = local_148.buffer >> ((byte)local_148.bp & 7);
                uVar7 = huffmanDecodeSymbol(&local_148,local_f0);
                bitlen = local_e8;
                __s = local_120;
                if (uVar7 < 0x10) {
                  puVar14 = bitlen_00;
                  uVar11 = (uint)local_f8;
                  if (uVar23 < (uint)local_f8) {
                    uVar11 = 0;
                    puVar14 = local_120;
                  }
                  puVar14[uVar23 - uVar11] = uVar7;
                  uVar23 = uVar23 + 1;
                }
                else {
                  iVar13 = (int)local_c8;
                  if (uVar7 == 0x12) {
                    uVar7 = local_148.buffer & 0x7f;
                    local_148.buffer = local_148.buffer >> 7;
                    local_148.bp = local_148.bp + 7;
                    uVar17 = (ulong)uVar23;
                    iVar24 = -uVar23;
                    puVar14 = local_120 + uVar17;
                    iVar8 = uVar7 + 0xb;
                    do {
                      if (uVar18 <= uVar17) {
                        uVar23 = -iVar24;
                        local_10c = 0xf;
                        goto LAB_001dda59;
                      }
                      puVar20 = bitlen_00 + (uint)(iVar13 + (int)uVar17);
                      if (uVar17 < local_c0) {
                        puVar20 = puVar14;
                      }
                      *puVar20 = 0;
                      uVar17 = uVar17 + 1;
                      iVar24 = iVar24 + -1;
                      puVar14 = puVar14 + 1;
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                  else if (uVar7 == 0x11) {
                    uVar7 = local_148.buffer & 7;
                    local_148.buffer = local_148.buffer >> 3;
                    local_148.bp = local_148.bp + 3;
                    uVar17 = (ulong)uVar23;
                    iVar24 = -uVar23;
                    puVar14 = local_120 + uVar17;
                    iVar8 = uVar7 + 3;
                    do {
                      if (uVar18 <= uVar17) {
                        uVar23 = -iVar24;
                        local_10c = 0xe;
                        goto LAB_001dda59;
                      }
                      puVar20 = bitlen_00 + (uint)(iVar13 + (int)uVar17);
                      if (uVar17 < local_c0) {
                        puVar20 = puVar14;
                      }
                      *puVar20 = 0;
                      uVar17 = uVar17 + 1;
                      iVar24 = iVar24 + -1;
                      puVar14 = puVar14 + 1;
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                  else {
                    if (uVar7 != 0x10) {
                      uVar16 = 0x10;
                      goto LAB_001dd246;
                    }
                    if (uVar23 == 0) {
                      uVar16 = 0x36;
                      goto LAB_001dd246;
                    }
                    uVar7 = local_148.buffer & 3;
                    local_148.buffer = local_148.buffer >> 2;
                    local_148.bp = local_148.bp + 2;
                    puVar14 = bitlen_00 + ((uVar23 - 0x102) + (int)local_e0);
                    if (uVar23 < local_cc) {
                      puVar14 = local_120 + (uVar23 - 1);
                    }
                    uVar11 = *puVar14;
                    uVar17 = (ulong)uVar23;
                    iVar24 = -uVar23;
                    puVar14 = local_120 + uVar17;
                    iVar8 = uVar7 + 3;
                    do {
                      if (uVar18 <= uVar17) {
                        uVar23 = -iVar24;
                        local_10c = 0xd;
                        goto LAB_001dda59;
                      }
                      puVar20 = bitlen_00 + (uint)(iVar13 + (int)uVar17);
                      if (uVar17 < local_c0) {
                        puVar20 = puVar14;
                      }
                      *puVar20 = uVar11;
                      uVar17 = uVar17 + 1;
                      iVar24 = iVar24 + -1;
                      puVar14 = puVar14 + 1;
                      iVar8 = iVar8 + -1;
                    } while (iVar8 != 0);
                  }
                  uVar23 = -iVar24;
                }
LAB_001dda59:
                if (local_148.bitsize < local_148.bp) goto LAB_001dd246;
              } while (uVar23 < uVar6);
              uVar16 = local_10c;
              if (local_10c == 0) {
                if (local_120[0x100] == 0) {
                  uVar16 = 0x40;
                }
                else {
                  uVar16 = HuffmanTree_makeFromLengths(&local_88,local_120,0x120,0xf);
                  if (uVar16 == 0) {
                    uVar16 = HuffmanTree_makeFromLengths(&local_b8,bitlen_00,0x20,0xf);
                  }
                }
              }
            }
          }
LAB_001dd246:
          free(bitlen);
          free(__s);
          free(bitlen_00);
          HuffmanTree_cleanup(&local_58);
          settings = local_108;
LAB_001dd273:
          if (uVar16 == 0) {
            local_f0 = (HuffmanTree *)local_b8.table_len;
            local_d8 = local_b8.table_value;
            local_120 = (uint *)local_88.table_value;
            local_f8 = (HuffmanTree *)local_88.table_len;
            codetree = (HuffmanTree *)local_88.table_len;
LAB_001dd300:
            do {
              uVar18 = local_148.bp >> 3;
              if (uVar18 + 4 < local_148.size) {
                bVar10 = (byte)local_148.bp & 7;
                local_148.buffer =
                     ((uint)local_148.data[uVar18 + 4] << 0x18) << (8 - bVar10 & 0x1f) |
                     *(uint *)(local_148.data + uVar18) >> bVar10;
              }
              else {
                local_148.buffer = 0;
                if (uVar18 < local_148.size) {
                  local_148.buffer = (uint)local_148.data[uVar18];
                }
                if (uVar18 + 1 < local_148.size) {
                  local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 1] << 8;
                }
                if (uVar18 + 2 < local_148.size) {
                  local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 2] << 0x10;
                }
                if (uVar18 + 3 < local_148.size) {
                  local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 3] << 0x18;
                }
                local_148.buffer = local_148.buffer >> ((byte)local_148.bp & 7);
              }
              uVar16 = huffmanDecodeSymbol(&local_148,codetree);
              p = local_118;
              if (uVar16 < 0x100) {
                sVar3 = local_118->size;
                local_118->size = sVar3 + 1;
                local_118->data[sVar3] = (uchar)uVar16;
                uVar16 = huffmanDecodeSymbol(&local_148,codetree);
                if (0xff < uVar16) goto LAB_001dd40d;
                sVar3 = p->size;
                p->size = sVar3 + 1;
                p->data[sVar3] = (uchar)uVar16;
                bVar4 = true;
              }
              else {
LAB_001dd40d:
                if (uVar16 < 0x11e && uVar16 != 0x100) {
                  uVar18 = (ulong)(uVar16 - 0x101);
                  uVar17 = (ulong)LENGTHBASE[uVar18];
                  if (0xffffffffffffffeb < uVar18 - 0x1c) {
                    uVar12 = local_148.bp >> 3;
                    if (uVar12 + 3 < local_148.size) {
                      uVar16 = *(uint *)(local_148.data + uVar12);
                    }
                    else {
                      uVar16 = 0;
                      if (uVar12 < local_148.size) {
                        uVar16 = (uint)local_148.data[uVar12];
                      }
                      if (uVar12 + 1 < local_148.size) {
                        uVar16 = uVar16 | (uint)local_148.data[uVar12 + 1] << 8;
                      }
                      if (uVar12 + 2 < local_148.size) {
                        uVar16 = uVar16 | (uint)local_148.data[uVar12 + 2] << 0x10;
                      }
                    }
                    bVar10 = (byte)local_148.bp;
                    local_148.bp = local_148.bp + LENGTHEXTRA[uVar18];
                    uVar17 = uVar17 + (~(-1 << ((byte)LENGTHEXTRA[uVar18] & 0x1f)) &
                                      uVar16 >> (bVar10 & 7));
                  }
                  uVar18 = local_148.bp >> 3;
                  bVar10 = (byte)local_148.bp;
                  if (uVar18 + 4 < local_148.size) {
                    local_148.buffer =
                         ((uint)local_148.data[uVar18 + 4] << 0x18) << (8 - (bVar10 & 7) & 0x1f) |
                         *(uint *)(local_148.data + uVar18) >> (bVar10 & 7);
                  }
                  else {
                    local_148.buffer = 0;
                    if (uVar18 < local_148.size) {
                      local_148.buffer = (uint)local_148.data[uVar18];
                    }
                    if (uVar18 + 1 < local_148.size) {
                      local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 1] << 8;
                    }
                    if (uVar18 + 2 < local_148.size) {
                      local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 2] << 0x10
                      ;
                    }
                    if (uVar18 + 3 < local_148.size) {
                      local_148.buffer = local_148.buffer | (uint)local_148.data[uVar18 + 3] << 0x18
                      ;
                    }
                    local_148.buffer = local_148.buffer >> (bVar10 & 7);
                  }
                  uVar16 = huffmanDecodeSymbol(&local_148,local_f0);
                  if (0x1d < uVar16) {
                    uVar16 = (uint)(uVar16 < 0x20) * 2 + 0x10;
                    goto LAB_001dd277;
                  }
                  uVar6 = DISTANCEBASE[uVar16];
                  if (3 < uVar16) {
                    bVar10 = (byte)DISTANCEEXTRA[uVar16];
                    uVar7 = ~(-1 << (bVar10 & 0x1f)) & local_148.buffer;
                    local_148.buffer = local_148.buffer >> (bVar10 & 0x1f);
                    local_148.bp = local_148.bp + DISTANCEEXTRA[uVar16];
                    uVar6 = uVar6 + uVar7;
                  }
                  uVar18 = local_118->size;
                  uVar12 = (ulong)uVar6;
                  lVar25 = uVar18 - uVar12;
                  settings = local_108;
                  if (uVar18 < uVar12) {
                    uVar16 = 0x34;
                    goto LAB_001dd277;
                  }
                  local_118->size = uVar18 + uVar17;
                  lVar21 = uVar17 - uVar12;
                  if (uVar17 < uVar12 || lVar21 == 0) {
                    bVar4 = true;
                    codetree = local_f8;
                    p = local_118;
                    if (uVar17 != 0) {
                      memcpy(local_118->data + uVar18,local_118->data + lVar25,uVar17);
                      codetree = local_f8;
                      p = local_118;
                      settings = local_108;
                    }
                  }
                  else {
                    if (uVar12 != 0) {
                      memcpy(local_118->data + uVar18,local_118->data + lVar25,uVar12);
                    }
                    lVar15 = uVar18 + uVar12;
                    do {
                      puVar1 = local_118->data + lVar25;
                      lVar25 = lVar25 + 1;
                      local_118->data[lVar15] = *puVar1;
                      lVar15 = lVar15 + 1;
                      lVar21 = lVar21 + -1;
                    } while (lVar21 != 0);
                    bVar4 = true;
                    codetree = local_f8;
                    p = local_118;
                    settings = local_108;
                  }
                }
                else {
                  if (uVar16 != 0x100) {
                    uVar16 = 0x10;
                    goto LAB_001dd277;
                  }
                  bVar4 = false;
                  p = local_118;
                }
              }
              if ((p->allocsize - p->size < 0x104) &&
                 (uVar16 = ucvector_reserve(p,p->size + 0x104), p = local_118, uVar16 == 0)) {
                uVar16 = 0x53;
                goto LAB_001dd277;
              }
              if (local_148.bitsize < local_148.bp) {
                uVar16 = 0x33;
                goto LAB_001dd277;
              }
              if (uVar22 != 0) {
                if (!(bool)(bVar4 & p->size <= uVar22)) {
                  uVar16 = 0x6d;
                  if (p->size <= uVar22) {
                    uVar16 = 0;
                  }
                  goto LAB_001dd277;
                }
                goto LAB_001dd300;
              }
            } while (bVar4);
            uVar16 = 0;
          }
        }
LAB_001dd277:
        HuffmanTree_cleanup(&local_88);
        HuffmanTree_cleanup(&local_b8);
        out = local_118;
        if (uVar16 != 0) {
          return uVar16;
        }
      }
      if ((settings->max_output_size != 0) && (settings->max_output_size < out->size)) {
        return 0x6d;
      }
    } while ((local_fc & 1) == 0);
    uVar16 = 0;
  }
  return uVar16;
}

Assistant:

static unsigned lodepng_inflatev(ucvector* out,
                                 const unsigned char* in, size_t insize,
                                 const LodePNGDecompressSettings* settings) {
  unsigned BFINAL = 0;
  LodePNGBitReader reader;
  unsigned error = LodePNGBitReader_init(&reader, in, insize);

  if(error) return error;

  while(!BFINAL) {
    unsigned BTYPE;
    if(reader.bitsize - reader.bp < 3) return 52; /*error, bit pointer will jump past memory*/
    ensureBits9(&reader, 3);
    BFINAL = readBits(&reader, 1);
    BTYPE = readBits(&reader, 2);

    if(BTYPE == 3) return 20; /*error: invalid BTYPE*/
    else if(BTYPE == 0) error = inflateNoCompression(out, &reader, settings); /*no compression*/
    else error = inflateHuffmanBlock(out, &reader, BTYPE, settings->max_output_size); /*compression, BTYPE 01 or 10*/
    if(!error && settings->max_output_size && out->size > settings->max_output_size) error = 109;
    if(error) break;
  }

  return error;
}